

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

void __thiscall CFG::addNode(CFG *this,CfgNode *node)

{
  Addr AVar1;
  Type TVar2;
  mapped_type *ppCVar3;
  Addr local_20;
  Addr addr;
  CfgNode *node_local;
  CFG *this_local;
  
  addr = (Addr)node;
  node_local = (CfgNode *)this;
  TVar2 = CfgNode::type(node);
  switch(TVar2) {
  case CFG_ENTRY:
    if (this->m_entryNode != (CfgNode *)0x0) {
      __assert_fail("m_entryNode == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                    ,0x44,"void CFG::addNode(CfgNode *)");
    }
    this->m_entryNode = (CfgNode *)addr;
    break;
  case CFG_BLOCK:
  case CFG_PHANTOM:
    local_20 = CfgNode::node2addr((CfgNode *)addr);
    if (local_20 == 0) {
      __assert_fail("addr != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                    ,0x4a,"void CFG::addNode(CfgNode *)");
    }
    ppCVar3 = std::
              map<unsigned_long,_CfgNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
              ::operator[](&this->m_nodesMap,&local_20);
    AVar1 = addr;
    if (*ppCVar3 != (mapped_type)0x0) {
      __assert_fail("m_nodesMap[addr] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                    ,0x4c,"void CFG::addNode(CfgNode *)");
    }
    ppCVar3 = std::
              map<unsigned_long,_CfgNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
              ::operator[](&this->m_nodesMap,&local_20);
    *ppCVar3 = (mapped_type)AVar1;
    break;
  case CFG_EXIT:
    if (this->m_exitNode != (CfgNode *)0x0) {
      __assert_fail("m_exitNode == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                    ,0x50,"void CFG::addNode(CfgNode *)");
    }
    this->m_exitNode = (CfgNode *)addr;
    break;
  case CFG_HALT:
    if (this->m_haltNode != (CfgNode *)0x0) {
      __assert_fail("m_haltNode == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                    ,0x54,"void CFG::addNode(CfgNode *)");
    }
    this->m_haltNode = (CfgNode *)addr;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                  ,0x58,"void CFG::addNode(CfgNode *)");
  }
  std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::insert
            (&this->m_nodes,(value_type *)&addr);
  this->m_status = UNCHECKED;
  return;
}

Assistant:

void CFG::addNode(CfgNode* node) {
	Addr addr;

	switch (node->type()) {
		case CfgNode::CFG_ENTRY:
			assert(m_entryNode == 0);
			m_entryNode = node;
			break;
		case CfgNode::CFG_BLOCK:
		case CfgNode::CFG_PHANTOM:
			addr = CfgNode::node2addr(node);
			assert(addr != 0);

			assert(m_nodesMap[addr] == 0);
			m_nodesMap[addr] = node;
			break;
		case CfgNode::CFG_EXIT:
			assert(m_exitNode == 0);
			m_exitNode = node;
			break;
		case CfgNode::CFG_HALT:
			assert(m_haltNode == 0);
			m_haltNode = node;
			break;
		default:
			assert(false);
	}

	m_nodes.insert(node);
	m_status = CFG::UNCHECKED;
}